

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_reader.hpp
# Opt level: O0

ssize_t __thiscall
jsoncons::cbor::basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_>::read
          (basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_> *this,int __fd,
          void *__buf,size_t __nbytes)

{
  error_code ec_00;
  bool bVar1;
  undefined7 extraout_var;
  undefined8 uVar2;
  void *__buf_00;
  error_code ec;
  error_code *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffe8;
  size_t sVar3;
  ser_error *in_stack_fffffffffffffff0;
  ser_error *psVar4;
  
  std::error_code::error_code(in_stack_ffffffffffffffb0);
  read(this,(int)&stack0xffffffffffffffe8,__buf_00,__nbytes);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    return CONCAT71(extraout_var,bVar1);
  }
  uVar2 = __cxa_allocate_exception(0x58);
  sVar3 = in_stack_ffffffffffffffe8;
  psVar4 = in_stack_fffffffffffffff0;
  line((basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_> *)0x30ae56);
  column((basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_> *)0x30ae67);
  ec_00._M_cat = (error_category *)psVar4;
  ec_00._0_8_ = sVar3;
  ser_error::ser_error
            (in_stack_fffffffffffffff0,ec_00,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffd0);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void read()
    {
        std::error_code ec;
        read(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,line(),column()));
        }
    }